

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BasicReporter::ReportCounts(BasicReporter *this,Totals *totals,string *allPrefix)

{
  size_t sVar1;
  pointer pcVar2;
  ostream *poVar3;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  undefined1 local_b0 [24];
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  sVar1 = (totals->assertions).failed;
  if ((totals->assertions).passed + sVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((this->m_config).stream,"No tests ran",0xc);
    return;
  }
  if (sVar1 == 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->m_config).stream,(allPrefix->_M_dataplus)._M_p,
                        allPrefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"tests passed (",0xe);
    pcVar2 = (pointer)(totals->assertions).passed;
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"assertion","");
    local_c0 = (undefined1  [8])pcVar2;
    local_b8._M_p = local_b0 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_78,local_70 + (long)local_78);
    poVar3 = operator<<(poVar3,(pluralise *)local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
    sVar1 = (totals->testCases).passed;
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"test case","");
    local_58 = (undefined1  [8])sVar1;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_98,local_90 + (long)local_98);
    poVar3 = operator<<(poVar3,(pluralise *)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if (local_b8._M_p != local_b0 + 8) {
      operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
    }
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
  }
  else {
    local_c0 = (undefined1  [8])local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"test case","");
    ReportCounts(this,(string *)local_c0,&totals->testCases,allPrefix);
    if (local_c0 != (undefined1  [8])local_b0) {
      operator_delete((void *)local_c0,local_b0._0_8_ + 1);
    }
    if ((totals->testCases).failed != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((this->m_config).stream," (",2);
      local_c0 = (undefined1  [8])local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"assertion","");
      ReportCounts(this,(string *)local_c0,&totals->assertions,allPrefix);
      if (local_c0 != (undefined1  [8])local_b0) {
        operator_delete((void *)local_c0,local_b0._0_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((this->m_config).stream,")",1);
    }
  }
  return;
}

Assistant:

void ReportCounts( const Totals& totals, const std::string& allPrefix = "All " ) {
            if( totals.assertions.total() == 0 ) {
                m_config.stream << "No tests ran";
            }
            else if( totals.assertions.failed ) {
                TextColour colour( TextColour::ResultError );
                ReportCounts( "test case", totals.testCases, allPrefix );
                if( totals.testCases.failed > 0 ) {
                    m_config.stream << " (";
                    ReportCounts( "assertion", totals.assertions, allPrefix );
                    m_config.stream << ")";
                }
            }
            else {
                TextColour colour( TextColour::ResultSuccess );
                m_config.stream   << allPrefix << "tests passed ("
                                    << pluralise( totals.assertions.passed, "assertion" ) << " in "
                                    << pluralise( totals.testCases.passed, "test case" ) << ")";
            }
        }